

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O2

void test<double>(string *filename,vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,
                 int target_level)

{
  vector<double,_std::allocator<double>_> data;
  size_t num_elements;
  vector<double,_std::allocator<double>_> data_ori;
  _Vector_base<double,_std::allocator<double>_> local_50;
  size_t local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  local_38 = 0;
  MGARD::readfile<double>
            ((vector<double,_std::allocator<double>_> *)&local_50,(filename->_M_dataplus)._M_p,
             &local_38);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,
             (vector<double,_std::allocator<double>_> *)&local_50);
  test_decompose<double>((vector<double,_std::allocator<double>_> *)&local_50,dims,target_level);
  test_recompose<double>((vector<double,_std::allocator<double>_> *)&local_50,dims,target_level);
  MGARD::print_statistics<double>
            (local_30._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_start,local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void test(string filename, const vector<size_t>& dims, int target_level){
    size_t num_elements = 0;
    auto data = MGARD::readfile<T>(filename.c_str(), num_elements);
    auto data_ori(data);
    test_decompose(data, dims, target_level);
    test_recompose(data, dims, target_level);
    MGARD::print_statistics(data_ori.data(), data.data(), num_elements);
}